

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrulematcher.cpp
# Opt level: O0

bool __thiscall QMimeMagicRuleMatcher::matches(QMimeMagicRuleMatcher *this,QByteArray *data)

{
  bool bVar1;
  const_iterator o;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QMimeMagicRule *magicRule;
  QList<QMimeMagicRule> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QMimeMagicRule *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QMimeMagicRule>::begin
                       ((QList<QMimeMagicRule> *)
                        CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  o = QList<QMimeMagicRule>::end
                ((QList<QMimeMagicRule> *)
                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  do {
    bVar1 = QList<QMimeMagicRule>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) {
      bVar1 = false;
LAB_008f5dab:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return bVar1;
      }
      __stack_chk_fail();
    }
    QList<QMimeMagicRule>::const_iterator::operator*(&local_10);
    bVar1 = QMimeMagicRule::matches
                      ((QMimeMagicRule *)
                       CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),in_RDI);
    if (bVar1) {
      bVar1 = true;
      goto LAB_008f5dab;
    }
    QList<QMimeMagicRule>::const_iterator::operator++(&local_10);
  } while( true );
}

Assistant:

bool QMimeMagicRuleMatcher::matches(const QByteArray &data) const
{
    for (const QMimeMagicRule &magicRule : m_list) {
        if (magicRule.matches(data))
            return true;
    }

    return false;
}